

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::PragmaDefinition::PragmaDefinition
          (PragmaDefinition *this,VMContext *context,string *selector)

{
  string *selector_local;
  VMContext *context_local;
  PragmaDefinition *this_local;
  
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaDefinition_0020cee8;
  this->context = context;
  std::__cxx11::string::string((string *)&this->selector,(string *)selector);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector
            (&this->parameters);
  return;
}

Assistant:

PragmaDefinition::PragmaDefinition(VMContext *context, const std::string &selector)
    : context(context), selector(selector)
{
}